

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O0

void __thiscall wasm::exportFunction(wasm *this,Module *wasm,Name name,bool must_export)

{
  variant<wasm::Name,_wasm::HeapType> value;
  Name name_00;
  Name name_01;
  Name name_02;
  Module *this_00;
  Function *pFVar1;
  Export *pEVar2;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  Module *local_58;
  char *pcStack_50;
  Module *local_48;
  size_t local_40;
  Module *local_38;
  char *local_30;
  byte local_21;
  Module *pMStack_20;
  bool must_export_local;
  Module *wasm_local;
  Name name_local;
  
  local_30 = name.super_IString.str._M_len;
  local_21 = (byte)name.super_IString.str._M_str & 1;
  name_02.super_IString.str._M_str = local_30;
  name_02.super_IString.str._M_len = (size_t)wasm;
  local_38 = wasm;
  pMStack_20 = (Module *)this;
  wasm_local = wasm;
  name_local.super_IString.str._M_len = (size_t)local_30;
  pFVar1 = Module::getFunctionOrNull((Module *)this,name_02);
  if (pFVar1 == (Function *)0x0) {
    if (((local_21 ^ 0xff) & 1) == 0) {
      __assert_fail("!must_export",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/GenerateDynCalls.cpp"
                    ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
    }
  }
  else {
    local_48 = wasm_local;
    local_40 = name_local.super_IString.str._M_len;
    name_01.super_IString.str._M_str = (char *)name_local.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)wasm_local;
    pEVar2 = Module::getExportOrNull(pMStack_20,name_01);
    this_00 = pMStack_20;
    if (pEVar2 == (Export *)0x0) {
      pEVar2 = (Export *)operator_new(0x30);
      local_58 = wasm_local;
      pcStack_50 = (char *)name_local.super_IString.str._M_len;
      std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name&,void,void,wasm::Name,void>
                ((variant<wasm::Name,wasm::HeapType> *)&local_70,(Name *)&wasm_local);
      name_00.super_IString.str._M_str = pcStack_50;
      name_00.super_IString.str._M_len = (size_t)local_58;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_str = (char *)uStack_68;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_len = local_70;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_60;
      Export::Export(pEVar2,name_00,Function,value);
      Module::addExport(this_00,pEVar2);
    }
  }
  return;
}

Assistant:

static void exportFunction(Module& wasm, Name name, bool must_export) {
  if (!wasm.getFunctionOrNull(name)) {
    assert(!must_export);
    return;
  }
  if (wasm.getExportOrNull(name)) {
    return; // Already exported
  }
  wasm.addExport(new Export(name, ExternalKind::Function, name));
}